

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_metadata.cpp
# Opt level: O2

duckdb * __thiscall
duckdb::ParquetElementString<duckdb_parquet::FieldRepetitionType::type_const&>
          (duckdb *this,type *value,bool is_set)

{
  undefined3 in_register_00000011;
  undefined4 in_register_00000014;
  LogicalType aLStack_48 [24];
  string local_30;
  
  if (CONCAT31(in_register_00000011,is_set) == 0) {
    duckdb::LogicalType::LogicalType(aLStack_48,SQLNULL);
    duckdb::Value::Value((Value *)this,aLStack_48);
    duckdb::LogicalType::~LogicalType(aLStack_48);
  }
  else {
    ConvertParquetElementToString<duckdb_parquet::FieldRepetitionType::type_const&>
              (&local_30,(duckdb *)value,
               (type *)CONCAT44(in_register_00000014,CONCAT31(in_register_00000011,is_set)));
    duckdb::Value::Value((Value *)this,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return this;
}

Assistant:

Value ParquetElementString(T &&value, bool is_set) {
	if (!is_set) {
		return Value();
	}
	return Value(ConvertParquetElementToString(value));
}